

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_conn.cc
# Opt level: O3

void __thiscall CSocekt::inRecyConnectQueue(CSocekt *this,lp_connection_t pConn)

{
  size_t *psVar1;
  time_t tVar2;
  _List_node_base *p_Var3;
  
  muduo::MutexLock::lock(&this->m_recyconnqueueMutex);
  p_Var3 = (_List_node_base *)&this->m_recyconnectionList;
  do {
    p_Var3 = (((_List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)
              &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)&this->m_recyconnectionList) {
      tVar2 = time((time_t *)0x0);
      pConn->inRecyTime = tVar2;
      pConn->iCurrsequence = pConn->iCurrsequence + 1;
      p_Var3 = (_List_node_base *)operator_new(0x18);
      p_Var3[1]._M_next = (_List_node_base *)pConn;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      psVar1 = &(this->m_recyconnectionList).
                super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      LOCK();
      (this->m_total_recyconnection_n).value_ = (this->m_total_recyconnection_n).value_ + 1;
      UNLOCK();
      break;
    }
  } while ((lp_connection_t)p_Var3[1]._M_next != pConn);
  (this->m_recyconnqueueMutex).holder_ = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_recyconnqueueMutex);
  return;
}

Assistant:

void CSocekt::inRecyConnectQueue(lp_connection_t pConn)
{
    //ngx_log_stderr(0,"CSocekt::inRecyConnectQueue()执行，连接入到回收队列中.");
    
  //  std::list<lp_connection_t>::iterator pos;
    bool iffind = false;
    muduo::MutexLockGuard lock(m_recyconnqueueMutex); //针对连接回收列表的互斥量，因为线程ServerRecyConnectionThread()也有要用到这个回收列表；

    //先检查一下这个连接之前在不在队列中，防止被重复添加
    for(auto pos = m_recyconnectionList.begin(); pos != m_recyconnectionList.end(); pos++)
    {
        if((*pos) == pConn)
        {
            iffind = true;
            break;
        }
    }

    if(iffind == true)
    return ;

    pConn->inRecyTime = time(NULL);        //记录回收时间
    ++pConn->iCurrsequence;
    m_recyconnectionList.push_back(pConn); //等待ServerRecyConnectionThread线程自会处理 
    m_total_recyconnection_n.increment();            //待释放连接队列大小+1
    return;
}